

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObject::InitializeFromExistingSharedData
          (CSharedMemoryObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  DWORD DVar1;
  CObjectType *pCVar2;
  OBJECTINITROUTINE p_Var3;
  int iVar4;
  PAL_ERROR PVar5;
  LPVOID pvVar6;
  char16_t *string1;
  WCHAR *pWVar7;
  LPVOID __src;
  char *__format;
  SHMPTR shmptr;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xa8);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xa9);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_003309cc;
  this->m_ObjectDomain = SharedObject;
  shmptr = this->m_shmod;
  if (shmptr == 0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xb8);
    fprintf(_stderr,"Expression: SHMNULL != m_shmod\n");
    shmptr = this->m_shmod;
  }
  pvVar6 = SHMPtrToPtr(shmptr);
  if (pvVar6 == (LPVOID)0x0) {
    fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0xbd);
    __format = "Unable to map shared object data\n";
LAB_0033083d:
    fprintf(_stderr,__format);
    PVar5 = 0x54f;
  }
  else {
    if ((poa->sObjectName).m_dwStringLength == 0) {
      if (*(int *)((long)pvVar6 + 0x34) != 0) {
        pWVar7 = (WCHAR *)SHMPtrToPtr(*(SHMPTR *)((long)pvVar6 + 0x18));
        if (pWVar7 == (WCHAR *)0x0) {
          fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0xd6);
          __format = "Unable to map object name\n";
          goto LAB_0033083d;
        }
        DVar1 = *(DWORD *)((long)pvVar6 + 0x34);
        (poa->sObjectName).m_pwsz = pWVar7;
        (poa->sObjectName).m_dwStringLength = DVar1;
        (poa->sObjectName).m_dwMaxLength = DVar1 + 1;
      }
    }
    else if (*(int *)((long)pvVar6 + 0x34) != 0) {
      string1 = (char16_t *)SHMPtrToPtr(*(SHMPTR *)((long)pvVar6 + 0x18));
      if (string1 == (char16_t *)0x0) {
        fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0xe5);
        fprintf(_stderr,"Expression: NULL != wsz\n");
      }
      iVar4 = PAL_wcscmp(string1,(poa->sObjectName).m_pwsz);
      if (iVar4 != 0) {
        fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0xe6);
        fprintf(_stderr,"Expression: 0 == PAL_wcscmp(wsz, poa->sObjectName.GetString())\n");
      }
    }
    PVar5 = CPalObjectBase::Initialize(&this->super_CPalObjectBase,pthr,poa);
    if (PVar5 == 0) {
      if (*(SHMPTR *)((long)pvVar6 + 0x20) != 0) {
        __src = SHMPtrToPtr(*(SHMPTR *)((long)pvVar6 + 0x20));
        if (__src == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0xf9);
          __format = "Unable to map object immutable data\n";
          goto LAB_0033083d;
        }
        memcpy((this->super_CPalObjectBase).m_pvImmutableData,__src,
               (ulong)((this->super_CPalObjectBase).m_pot)->m_dwImmutableDataSize);
      }
      if (*(SHMPTR *)((long)pvVar6 + 0x28) != 0) {
        pvVar6 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar6 + 0x28));
        this->m_pvSharedData = pvVar6;
        if (pvVar6 == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","InitializeFromExistingSharedData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x104);
          __format = "Unable to map object shared data\n";
          goto LAB_0033083d;
        }
      }
      pCVar2 = (this->super_CPalObjectBase).m_pot;
      p_Var3 = pCVar2->m_pInitRoutine;
      if (p_Var3 == (OBJECTINITROUTINE)0x0) {
        PVar5 = 0;
      }
      else {
        PVar5 = (*p_Var3)(pthr,pCVar2,(this->super_CPalObjectBase).m_pvImmutableData,
                          this->m_pvSharedData,(this->super_CPalObjectBase).m_pvLocalData);
      }
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar5;
  }
LAB_003309cc:
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObject::InitializeFromExistingSharedData(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMObjData *psmod = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryObject::InitializeFromExistingSharedData"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    //
    // This object is obviously shared...
    //

    m_ObjectDomain = SharedObject;

    _ASSERTE(SHMNULL != m_shmod);

    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, m_shmod);
    if (NULL == psmod)
    {
        ASSERT("Unable to map shared object data\n");
        palError = ERROR_INTERNAL_ERROR;
        goto InitializeFromExistingSharedDataExit;
    }

    //
    // When we're being called on the duplicate handle path the passed
    // in object attributes likely won't have an object name in it.
    // If there is an object name in the shared data place that in the
    // object attributes so that the constructed object has a local copy
    // of the name
    //

    if (0 == poa->sObjectName.GetStringLength()
        && 0 != psmod->dwNameLength)
    {
        WCHAR *wsz;

        wsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
        if (NULL != wsz)
        {
            poa->sObjectName.SetStringWithLength(wsz, psmod->dwNameLength);
        }
        else
        {
            ASSERT("Unable to map object name\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }
#if _DEBUG
    else if (0 != psmod->dwNameLength)
    {
        WCHAR *wsz;

        //
        // Verify that the names are consistent
        //

        wsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
        _ASSERTE(NULL != wsz);
        _ASSERTE(0 == PAL_wcscmp(wsz, poa->sObjectName.GetString()));
    }
#endif // debug

    palError = CPalObjectBase::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeFromExistingSharedDataExit;
    }

    if (SHMNULL != psmod->shmObjImmutableData)
    {
        VOID *pv = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjImmutableData);
        if (NULL != pv)
        {
            memcpy(m_pvImmutableData, pv, m_pot->GetImmutableDataSize());
        }
        else
        {
            ASSERT("Unable to map object immutable data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }

    if (SHMNULL != psmod->shmObjSharedData)
    {
        m_pvSharedData = SHMPTR_TO_TYPED_PTR(VOID, psmod->shmObjSharedData);
        if (NULL == m_pvSharedData)
        {
            ASSERT("Unable to map object shared data\n");
            palError = ERROR_INTERNAL_ERROR;
            goto InitializeFromExistingSharedDataExit;
        }
    }

    if (NULL != m_pot->GetObjectInitRoutine())
    {
        palError = (*m_pot->GetObjectInitRoutine())(
            pthr,
            m_pot,
            m_pvImmutableData,
            m_pvSharedData,
            m_pvLocalData
            );
    }

InitializeFromExistingSharedDataExit:

    LOGEXIT("CSharedMemoryObject::InitalizeFromExistingSharedData returns %d\n", palError);

    return palError;
}